

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt_limits.c
# Opt level: O2

void test_psbt_read(psbt_test *test,uchar *p,size_t plen)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  char *__s;
  long lVar4;
  uchar *bytes;
  byte bVar5;
  ulong bufsize;
  wally_psbt *psbt;
  psbt_test *local_38;
  
  __s = test->hex;
  local_38 = test;
  sVar3 = strlen(__s);
  if (plen < sVar3 >> 1) {
    __assert_fail("hex_data_size(strlen(test->hex)) <= plen",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/libwally-core/src/ctest/test_psbt_limits.c"
                  ,0x50,"void test_psbt_read(const struct psbt_test *, unsigned char *, size_t)");
  }
  bufsize = 0;
  while( true ) {
    sVar3 = strlen(__s);
    if (sVar3 >> 1 < bufsize) {
      return;
    }
    bytes = p + (plen - bufsize);
    _Var1 = hex_decode(__s,bufsize * 2,bytes,bufsize);
    if (!_Var1) break;
    iVar2 = wally_psbt_from_bytes(bytes,bufsize,&psbt);
    if (iVar2 == 0) {
      wally_psbt_free(psbt);
    }
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      bVar5 = (byte)(1 << ((byte)lVar4 & 0x1f));
      p[plen - 1] = p[plen - 1] ^ bVar5;
      iVar2 = wally_psbt_from_bytes(bytes,bufsize,&psbt);
      if (iVar2 == 0) {
        wally_psbt_free(psbt);
      }
      p[plen - 1] = p[plen - 1] ^ bVar5;
    }
    bufsize = bufsize + 1;
    __s = local_38->hex;
  }
  abort();
}

Assistant:

static void test_psbt_read(const struct psbt_test *test,
                           unsigned char *p, size_t plen)
{
    size_t i;

    /* It can fit, otherwise adjust cliff() */
    assert(hex_data_size(strlen(test->hex)) <= plen);

    /* Unpack right next to the cliff */
    for (i = 0; i <= hex_data_size(strlen(test->hex)); i++) {
        struct wally_psbt *psbt;
        size_t bit;

        if (!hex_decode(test->hex, i * 2, p + plen - i, i))
            abort();

        /* Try it raw: probably will fail. */
        if (wally_psbt_from_bytes(p + plen - i, i, &psbt) == WALLY_OK)
            wally_psbt_free(psbt);

        /* Now try flipping each bit in last byte. */
        for (bit = 0; bit < 8; bit++) {
            p[plen - 1] ^= (1 << bit);
            if (wally_psbt_from_bytes(p + plen - i, i, &psbt) == WALLY_OK)
                wally_psbt_free(psbt);
            p[plen - 1] ^= (1 << bit);
        }
    }
}